

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

bool_t zzIsSumWEq(word *b,word *a,size_t n,word w)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 0;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = uVar2 | w + a[sVar1] ^ b[sVar1];
    w = (word)(b[sVar1] < a[sVar1]);
  }
  return (bool_t)(uVar2 == 0 && w == 0);
}

Assistant:

bool_t SAFE(zzIsSumWEq)(const word b[], const word a[], size_t n, 
	register word w)
{
	register word diff = 0;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	for (i = 0; i < n; ++i)
	{
		diff |= b[i] ^ (a[i] + w);
		w = wordLess01(b[i], a[i]);
	}
	return wordEq(diff | w, 0);
}